

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.hpp
# Opt level: O0

Color __thiscall
PointLight::sampleIrradiance
          (PointLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *param_5)

{
  vec3f *a;
  float *in_RCX;
  undefined8 *in_RDX;
  long in_RDI;
  vec3f *b;
  float fVar1;
  vec3f vVar2;
  Color CVar3;
  vec3f *in_stack_ffffffffffffff20;
  vec3f local_b8;
  vec3f local_a8;
  vec3f local_98;
  vec3f local_88;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  vec3f local_58;
  undefined8 local_48;
  float local_40;
  float *local_30;
  undefined8 *local_28;
  float fVar4;
  
  b = (vec3f *)(in_RDI + 0x18);
  local_30 = in_RCX;
  local_28 = in_RDX;
  vVar2 = ::operator-(in_stack_ffffffffffffff20,b);
  local_58.z = vVar2.z;
  local_40 = local_58.z;
  local_58._0_8_ = vVar2._0_8_;
  local_48._0_4_ = local_58.x;
  local_48._4_4_ = local_58.y;
  local_58 = vVar2;
  fVar1 = norm((vec3f *)0x190a1f);
  *local_30 = fVar1;
  vVar2 = ::operator-(in_stack_ffffffffffffff20,b);
  local_88.z = vVar2.z;
  local_70 = local_88.z;
  local_88._0_8_ = vVar2._0_8_;
  local_78._0_4_ = local_88.x;
  local_78._4_4_ = local_88.y;
  local_88 = vVar2;
  vVar2 = normalized(in_stack_ffffffffffffff20);
  local_98.z = vVar2.z;
  local_60 = local_98.z;
  local_98._0_8_ = vVar2._0_8_;
  local_68._0_4_ = local_98.x;
  local_68._4_4_ = local_98.y;
  *(float *)(local_28 + 1) = local_98.z;
  *local_28 = local_98._0_8_;
  a = (vec3f *)(in_RDI + 0xc);
  local_98 = vVar2;
  vVar2 = ::operator-(a,b);
  fVar1 = (float)((ulong)b >> 0x20);
  local_b8.z = vVar2.z;
  local_a8.z = local_b8.z;
  local_b8._0_8_ = vVar2._0_8_;
  local_a8.x = local_b8.x;
  local_a8.y = local_b8.y;
  sqrlen(&local_a8);
  vVar2 = operator/(a,fVar1);
  CVar3.x = vVar2.x;
  CVar3.y = vVar2.y;
  register0x00001240 = vVar2.z;
  return CVar3;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler&) const
	{
		dist = norm(position - surface);
		dirToLight = normalized(position - surface);
		return intensity / sqrlen(position - surface);
	}